

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O1

bool slang::ast::Bitstream::
     dynamicSizesMatch<slang::ast::Type,slang::ast::StreamingConcatenationExpression>
               (Type *destination,StreamingConcatenationExpression *source)

{
  unsigned_long uVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  DynamicSize sourceSize;
  DynamicSize destEmpty;
  DynamicSize destFill;
  DynamicSize local_68;
  DynamicSize local_50;
  DynamicSize local_38;
  
  bVar3 = false;
  dynamicBitstreamSize(&local_68,source,Source);
  dynamicBitstreamSize(&local_50,destination,DestEmpty);
  if (local_68.isValid != true) {
    return false;
  }
  if (local_50.isValid == true) {
    if ((local_68.fixed <= local_50.fixed) &&
       (bVar3 = local_68.multiplier != 0 || local_50.fixed == local_68.fixed,
       local_68.multiplier == 0 || (local_50.fixed - local_68.fixed) % local_68.multiplier == 0)) {
      return bVar3;
    }
    if (local_50.multiplier != 0) {
      uVar2 = local_68.fixed - local_50.fixed;
      if (local_68.fixed < local_50.fixed) {
        uVar2 = -(local_68.fixed - local_50.fixed);
      }
      uVar1 = std::__detail::__gcd<unsigned_long>(local_68.multiplier,local_50.multiplier);
      bVar4 = uVar2 % uVar1 == 0;
      if (bVar4) {
        return (bool)(bVar3 | bVar4);
      }
    }
    dynamicBitstreamSize(&local_38,destination,DestFill);
    if (local_38.isValid == true) {
      uVar2 = local_38.fixed - local_68.fixed;
      if (local_38.fixed < local_68.fixed) {
        uVar2 = -(local_38.fixed - local_68.fixed);
      }
      if (local_68.multiplier != 0 || local_38.multiplier != 0) {
        uVar1 = std::__detail::__gcd<unsigned_long>(local_68.multiplier,local_38.multiplier);
        uVar2 = uVar2 % uVar1;
      }
      return uVar2 == 0;
    }
  }
  return false;
}

Assistant:

bool Bitstream::dynamicSizesMatch(const T1& destination, const T2& source) {
    auto sourceSize = dynamicBitstreamSize(source, BitstreamSizeMode::Source);
    auto destEmpty = dynamicBitstreamSize(destination, BitstreamSizeMode::DestEmpty);
    if (!sourceSize || !destEmpty)
        return false;

    if (destEmpty.fixed >= sourceSize.fixed) {
        auto diff = destEmpty.fixed - sourceSize.fixed;
        if (!sourceSize.multiplier)
            return diff == 0;
        if (diff % sourceSize.multiplier == 0)
            return true;
    }

    if (destEmpty.multiplier > 0) { // only for "with" range
        auto diff = destEmpty.fixed > sourceSize.fixed ? destEmpty.fixed - sourceSize.fixed
                                                       : sourceSize.fixed - destEmpty.fixed;
        if (diff % std::gcd(sourceSize.multiplier, destEmpty.multiplier) == 0)
            return true;
    }

    auto destFill = dynamicBitstreamSize(destination, BitstreamSizeMode::DestFill);
    if (!destFill)
        return false;

    /* Follow IEEE standard to check dynamic-sized types at compile-time.
     // runtime error
     struct {bit a[$]; shortint b;} a = {{1,2,3,4}, 67};
     int b = int'(a);
     // sourceMultiplier=1 sourceFixedSize=16 destEmptyMultiplier=0 destEmptyFixedSize=32
     // destFillMultiplier=0 destFillFixedSize=32

     // compile time error
     typedef struct {byte a[$]; bit b;} dest_t;
     int a;
     dest_t b = dest_t'(a);
     // sourceMultiplier=0 sourceFixedSize=32 destEmptyMultiplier=0 destEmptyFixedSize=1
     // destFillMultiplier=8 destFillFixedSize=1
     */

    uint64_t remaining;
    if (sourceSize.fixed > destFill.fixed)
        remaining = sourceSize.fixed - destFill.fixed;
    else
        remaining = destFill.fixed - sourceSize.fixed;

    if (sourceSize.multiplier == 0 && destFill.multiplier == 0)
        return remaining == 0;

    return remaining % std::gcd(sourceSize.multiplier, destFill.multiplier) == 0;
}